

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O1

int X509_check_purpose(X509 *x,int id,int ca)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = x509v3_cache_extensions((X509 *)x);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else if (id == -1) {
    iVar1 = 1;
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    do {
      if (*(int *)((long)&xstandard[0].purpose + lVar3) == id) {
        lVar4 = (long)&xstandard[0].purpose + lVar3;
        break;
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0xd8);
    iVar1 = 0;
    if ((lVar4 != 0) &&
       ((id == 7 || ca == 0 ||
        (((uVar2 = (x->ex_data).dummy, (uVar2 & 2) == 0 || (((x->ex_data).field_0xc & 4) != 0)) &&
         (uVar2 = ~uVar2, (uVar2 & 0x2040) == 0 || (uVar2 & 0x11) == 0)))))) {
      iVar1 = (**(code **)(lVar4 + 8))(lVar4,x,ca);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int X509_check_purpose(X509 *x, int id, int ca) {
  // This differs from OpenSSL, which uses -1 to indicate a fatal error and 0 to
  // indicate an invalid certificate. BoringSSL uses 0 for both.
  if (!x509v3_cache_extensions(x)) {
    return 0;
  }

  if (id == -1) {
    return 1;
  }
  const X509_PURPOSE *pt = X509_PURPOSE_get0(id);
  if (pt == NULL) {
    return 0;
  }
  // Historically, |check_purpose| implementations other than |X509_PURPOSE_ANY|
  // called |check_ca|. This is redundant with the |X509_V_ERR_INVALID_CA|
  // logic, but |X509_check_purpose| is public API, so we preserve this
  // behavior.
  if (ca && id != X509_PURPOSE_ANY && !check_ca(x)) {
    return 0;
  }
  return pt->check_purpose(pt, x, ca);
}